

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O2

int32 ngram_model_add_class
                (ngram_model_t *model,char *classname,float32 classweight,char **words,
                float32 *weights,int32 n_words)

{
  byte bVar1;
  int32 tag_wid;
  int32 iVar2;
  uint classid;
  uint uVar3;
  glist_t pgVar4;
  ngram_class_t *pnVar5;
  ngram_class_s **ppnVar6;
  uint start_wid;
  ulong uVar7;
  
  tag_wid = ngram_wid(model,classname);
  iVar2 = ngram_unknown_wid(model);
  start_wid = 0xffffffff;
  uVar3 = 0xffffffff;
  if ((tag_wid != iVar2) ||
     (tag_wid = ngram_model_add_word(model,classname,classweight), tag_wid != -1)) {
    classid = (uint)model->n_classes;
    if (classid == 0x80) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
              ,0x352,"Number of classes cannot exceed 128 (sorry)\n");
    }
    else {
      uVar7 = 0;
      if (n_words < 1) {
        n_words = 0;
      }
      pgVar4 = (glist_t)0x0;
      for (; (uint)n_words != uVar7; uVar7 = uVar7 + 1) {
        uVar3 = ngram_add_word_internal(model,words[uVar7],classid);
        if (uVar3 == 0xffffffff) {
          return -1;
        }
        if (start_wid == 0xffffffff) {
          start_wid = uVar3 & 0xffffff;
        }
        pgVar4 = glist_add_float32(pgVar4,weights[uVar7]);
      }
      pgVar4 = glist_reverse(pgVar4);
      pnVar5 = ngram_class_new(model,tag_wid,start_wid,pgVar4);
      glist_free(pgVar4);
      uVar3 = 0xffffffff;
      if (pnVar5 != (ngram_class_t *)0x0) {
        bVar1 = model->n_classes + 1;
        model->n_classes = bVar1;
        if (model->classes == (ngram_class_s **)0x0) {
          ppnVar6 = (ngram_class_s **)
                    __ckd_calloc__(1,8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                   ,0x368);
        }
        else {
          ppnVar6 = (ngram_class_s **)
                    __ckd_realloc__(model->classes,(ulong)bVar1 << 3,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                    ,0x36c);
        }
        model->classes = ppnVar6;
        ppnVar6[classid] = pnVar5;
        uVar3 = classid;
      }
    }
  }
  return uVar3;
}

Assistant:

int32
ngram_model_add_class(ngram_model_t * model,
                      const char *classname,
                      float32 classweight,
                      char **words, const float32 * weights, int32 n_words)
{
    ngram_class_t *lmclass;
    glist_t classwords = NULL;
    int32 i, start_wid = -1;
    int32 classid, tag_wid;

    /* Check if classname already exists in model.  If not, add it. */
    if ((tag_wid =
         ngram_wid(model, classname)) == ngram_unknown_wid(model)) {
        tag_wid = ngram_model_add_word(model, classname, classweight);
        if (tag_wid == NGRAM_INVALID_WID)
            return -1;
    }

    if (model->n_classes == 128) {
        E_ERROR("Number of classes cannot exceed 128 (sorry)\n");
        return -1;
    }
    classid = model->n_classes;
    for (i = 0; i < n_words; ++i) {
        int32 wid;

        wid = ngram_add_word_internal(model, words[i], classid);
        if (wid == NGRAM_INVALID_WID)
            return -1;
        if (start_wid == -1)
            start_wid = NGRAM_BASEWID(wid);
        classwords = glist_add_float32(classwords, weights[i]);
    }
    classwords = glist_reverse(classwords);
    lmclass = ngram_class_new(model, tag_wid, start_wid, classwords);
    glist_free(classwords);
    if (lmclass == NULL)
        return -1;

    ++model->n_classes;
    if (model->classes == NULL)
        model->classes = ckd_calloc(1, sizeof(*model->classes));
    else
        model->classes = ckd_realloc(model->classes,
                                     model->n_classes *
                                     sizeof(*model->classes));
    model->classes[classid] = lmclass;
    return classid;
}